

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::
Inline_Range_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Inline_Range_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
              *this,Dispatch_State *t_ss)

{
  size_t *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  string_view t_name;
  array<chaiscript::Boxed_Value,_2UL> params;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             &params,(Dispatch_State *)
                     **(undefined8 **)
                       (**(long **)(((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl
                                    ._M_rwlock.__align + 0x50) + 0x50));
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             (params._M_elems + 1),
             *(Dispatch_State **)
              (*(long *)(**(long **)(((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex).
                                     _M_impl._M_rwlock.__align + 0x50) + 0x50) + 8));
  local_30._8_8_ = &local_30;
  t_name._M_str = (char *)0xe;
  t_name._M_len = *in_RDX;
  local_30._M_allocated_capacity =
       (size_type)
       (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)&params;
  chaiscript::detail::Dispatch_Engine::call_function
            ((Dispatch_Engine *)this,t_name,(atomic_uint_fast32_t *)"generate_range",
             (Function_Params *)&t_ss[3].m_stack_holder,(Type_Conversions_State *)&local_30);
  std::array<chaiscript::Boxed_Value,_2UL>::~array(&params);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        try {
          std::array<Boxed_Value, 2> params{this->children[0]->children[0]->children[0]->eval(t_ss),
                                            this->children[0]->children[0]->children[1]->eval(t_ss)};

          return t_ss->call_function("generate_range", m_loc, Function_Params{params}, t_ss.conversions());
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error("Unable to generate range vector, while calling 'generate_range'", e.parameters, e.functions, false, *t_ss);
        }
      }